

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalNinjaGenerator.cxx
# Opt level: O3

void __thiscall
cmLocalNinjaGenerator::AddCustomCommandTarget
          (cmLocalNinjaGenerator *this,cmCustomCommand *cc,cmGeneratorTarget *target)

{
  pointer *pppcVar1;
  iterator __position;
  pair<std::_Rb_tree_iterator<std::pair<const_cmCustomCommand_*const,_std::set<cmGeneratorTarget_*,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>_>_>,_bool>
  pVar2;
  cmGeneratorTarget *local_90;
  cmCustomCommand *local_88;
  pair<const_cmCustomCommand_*const,_std::set<cmGeneratorTarget_*,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>_>
  local_80;
  _Rb_tree<cmGeneratorTarget_*,_cmGeneratorTarget_*,_std::_Identity<cmGeneratorTarget_*>,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>
  local_48;
  
  local_48._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_48._M_impl.super__Rb_tree_header._M_header;
  local_48._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_48._M_impl._0_8_ = 0;
  local_48._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_48._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_48._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_80.second._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_80.second._M_t._M_impl.super__Rb_tree_header._M_header;
  local_80.second._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_80.second._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_80.second._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_90 = target;
  local_88 = cc;
  local_80.first = cc;
  local_80.second._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_80.second._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_48._M_impl.super__Rb_tree_header._M_header._M_right =
       local_48._M_impl.super__Rb_tree_header._M_header._M_left;
  std::
  _Rb_tree<cmGeneratorTarget_*,_cmGeneratorTarget_*,_std::_Identity<cmGeneratorTarget_*>,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>
  ::~_Rb_tree(&local_48);
  pVar2 = std::
          _Rb_tree<cmCustomCommand_const*,std::pair<cmCustomCommand_const*const,std::set<cmGeneratorTarget*,std::less<cmGeneratorTarget*>,std::allocator<cmGeneratorTarget*>>>,std::_Select1st<std::pair<cmCustomCommand_const*const,std::set<cmGeneratorTarget*,std::less<cmGeneratorTarget*>,std::allocator<cmGeneratorTarget*>>>>,std::less<cmCustomCommand_const*>,std::allocator<std::pair<cmCustomCommand_const*const,std::set<cmGeneratorTarget*,std::less<cmGeneratorTarget*>,std::allocator<cmGeneratorTarget*>>>>>
          ::
          _M_emplace_unique<std::pair<cmCustomCommand_const*const,std::set<cmGeneratorTarget*,std::less<cmGeneratorTarget*>,std::allocator<cmGeneratorTarget*>>>&>
                    ((_Rb_tree<cmCustomCommand_const*,std::pair<cmCustomCommand_const*const,std::set<cmGeneratorTarget*,std::less<cmGeneratorTarget*>,std::allocator<cmGeneratorTarget*>>>,std::_Select1st<std::pair<cmCustomCommand_const*const,std::set<cmGeneratorTarget*,std::less<cmGeneratorTarget*>,std::allocator<cmGeneratorTarget*>>>>,std::less<cmCustomCommand_const*>,std::allocator<std::pair<cmCustomCommand_const*const,std::set<cmGeneratorTarget*,std::less<cmGeneratorTarget*>,std::allocator<cmGeneratorTarget*>>>>>
                      *)&this->CustomCommandTargets,&local_80);
  if (((undefined1  [16])pVar2 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    __position._M_current =
         (this->CustomCommands).
         super__Vector_base<const_cmCustomCommand_*,_std::allocator<const_cmCustomCommand_*>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->CustomCommands).
        super__Vector_base<const_cmCustomCommand_*,_std::allocator<const_cmCustomCommand_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<cmCustomCommand_const*,std::allocator<cmCustomCommand_const*>>::
      _M_realloc_insert<cmCustomCommand_const*const&>
                ((vector<cmCustomCommand_const*,std::allocator<cmCustomCommand_const*>> *)
                 &this->CustomCommands,__position,&local_88);
    }
    else {
      *__position._M_current = cc;
      pppcVar1 = &(this->CustomCommands).
                  super__Vector_base<const_cmCustomCommand_*,_std::allocator<const_cmCustomCommand_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppcVar1 = *pppcVar1 + 1;
    }
  }
  std::
  _Rb_tree<cmGeneratorTarget*,cmGeneratorTarget*,std::_Identity<cmGeneratorTarget*>,std::less<cmGeneratorTarget*>,std::allocator<cmGeneratorTarget*>>
  ::_M_insert_unique<cmGeneratorTarget*const&>
            ((_Rb_tree<cmGeneratorTarget*,cmGeneratorTarget*,std::_Identity<cmGeneratorTarget*>,std::less<cmGeneratorTarget*>,std::allocator<cmGeneratorTarget*>>
              *)&pVar2.first._M_node._M_node[1]._M_parent,&local_90);
  std::
  _Rb_tree<cmGeneratorTarget_*,_cmGeneratorTarget_*,_std::_Identity<cmGeneratorTarget_*>,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>
  ::~_Rb_tree(&local_80.second._M_t);
  return;
}

Assistant:

void cmLocalNinjaGenerator::AddCustomCommandTarget(cmCustomCommand const* cc,
                                                   cmGeneratorTarget* target)
{
  CustomCommandTargetMap::value_type v(cc, std::set<cmGeneratorTarget*>());
  std::pair<CustomCommandTargetMap::iterator, bool> ins =
    this->CustomCommandTargets.insert(v);
  if (ins.second) {
    this->CustomCommands.push_back(cc);
  }
  ins.first->second.insert(target);
}